

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_remove_table(nk_window *win,nk_table *tbl)

{
  nk_table *tbl_local;
  nk_window *win_local;
  
  if (win->tables == tbl) {
    win->tables = tbl->next;
  }
  if (tbl->next != (nk_table *)0x0) {
    tbl->next->prev = tbl->prev;
  }
  if (tbl->prev != (nk_table *)0x0) {
    tbl->prev->next = tbl->next;
  }
  tbl->next = (nk_table *)0x0;
  tbl->prev = (nk_table *)0x0;
  return;
}

Assistant:

NK_LIB void
nk_remove_table(struct nk_window *win, struct nk_table *tbl)
{
if (win->tables == tbl)
win->tables = tbl->next;
if (tbl->next)
tbl->next->prev = tbl->prev;
if (tbl->prev)
tbl->prev->next = tbl->next;
tbl->next = 0;
tbl->prev = 0;
}